

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

size_t HUF_decompress4X2_usingDTable_internal_fast
                 (void *dst,size_t dstSize,void *cSrc,size_t cSrcSize,HUF_DTable *DTable,
                 HUF_DecompressFastLoopFn loopFn)

{
  BYTE *pBVar1;
  BYTE *pBVar2;
  BYTE *pBVar3;
  long lVar4;
  long lVar5;
  size_t sVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  BYTE *pBVar10;
  ulong uVar11;
  size_t sVar12;
  int iVar13;
  ulong *puVar14;
  ulong *in_R10;
  ulong *puVar15;
  ulong in_R11;
  BYTE *pBVar16;
  uint uVar17;
  ulong uVar18;
  bool bVar19;
  HUF_DecompressFastArgs args;
  HUF_DecompressFastArgs local_c8;
  
  puVar14 = (ulong *)DTable;
  sVar6 = HUF_DecompressFastArgs_init(&local_c8,dst,dstSize,cSrc,cSrcSize,DTable);
  if (0xffffffffffffff87 < sVar6 - 1) {
    return sVar6;
  }
  if (local_c8.ip[0] < local_c8.ilimit) {
    __assert_fail("args.ip[0] >= args.ilimit",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x928e,
                  "size_t HUF_decompress4X2_usingDTable_internal_fast(void *, size_t, const void *, size_t, const HUF_DTable *, HUF_DecompressFastLoopFn)"
                 );
  }
  pBVar16 = (BYTE *)((long)cSrc + 6);
  HUF_decompress4X2_usingDTable_internal_fast_c_loop(&local_c8);
  if (local_c8.ip[0] < pBVar16) {
    __assert_fail("args.ip[0] >= iend",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x9292,
                  "size_t HUF_decompress4X2_usingDTable_internal_fast(void *, size_t, const void *, size_t, const HUF_DTable *, HUF_DecompressFastLoopFn)"
                 );
  }
  if (local_c8.ip[1] < pBVar16) {
    __assert_fail("args.ip[1] >= iend",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x9293,
                  "size_t HUF_decompress4X2_usingDTable_internal_fast(void *, size_t, const void *, size_t, const HUF_DTable *, HUF_DecompressFastLoopFn)"
                 );
  }
  if (local_c8.ip[2] < pBVar16) {
    __assert_fail("args.ip[2] >= iend",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x9294,
                  "size_t HUF_decompress4X2_usingDTable_internal_fast(void *, size_t, const void *, size_t, const HUF_DTable *, HUF_DecompressFastLoopFn)"
                 );
  }
  if (local_c8.ip[3] < pBVar16) {
    __assert_fail("args.ip[3] >= iend",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x9295,
                  "size_t HUF_decompress4X2_usingDTable_internal_fast(void *, size_t, const void *, size_t, const HUF_DTable *, HUF_DecompressFastLoopFn)"
                 );
  }
  pBVar1 = (BYTE *)((long)dst + dstSize);
  if (pBVar1 < local_c8.op[3]) {
    __assert_fail("args.op[3] <= oend",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                  ,0x9296,
                  "size_t HUF_decompress4X2_usingDTable_internal_fast(void *, size_t, const void *, size_t, const HUF_DTable *, HUF_DecompressFastLoopFn)"
                 );
  }
  uVar7 = dstSize + 3 >> 2;
  lVar9 = 0;
LAB_001db7ee:
  uVar11 = (long)pBVar1 - (long)dst;
  dst = (BYTE *)((long)dst + uVar7);
  if (uVar11 < uVar7) {
    dst = pBVar1;
  }
  if ((dst < local_c8.op[lVar9]) ||
     (puVar15 = (ulong *)local_c8.ip[lVar9], puVar15 < local_c8.iend[lVar9] + -8)) {
    bVar19 = false;
    sVar12 = 0xffffffffffffffec;
    puVar15 = in_R10;
  }
  else {
    pBVar16 = (BYTE *)*puVar15;
    in_R11 = 0;
    for (uVar11 = local_c8.bits[lVar9]; (uVar11 & 1) == 0; uVar11 = uVar11 >> 1 | 0x8000000000000000
        ) {
      in_R11 = in_R11 + 1;
    }
    cSrcSize = (long)local_c8.iend[0] + 8;
    bVar19 = true;
    sVar12 = 0;
    puVar14 = (ulong *)local_c8.iend[0];
  }
  if (bVar19) {
    pBVar2 = local_c8.op[lVar9];
    iVar13 = (int)puVar14;
    pBVar10 = pBVar2;
    if (7 < (ulong)((long)dst - (long)pBVar2)) {
      do {
        uVar17 = (uint)in_R11;
        if (uVar17 < 0x41) {
          if (puVar15 < cSrcSize) {
            if (puVar15 == puVar14) goto LAB_001db875;
            uVar8 = in_R11 >> 3 & 0x1fffffff;
            bVar19 = puVar14 <= (ulong *)((long)puVar15 - uVar8);
            uVar11 = (ulong)(uint)((int)puVar15 - iVar13);
            if (bVar19) {
              uVar11 = uVar8;
            }
            uVar17 = uVar17 + (int)uVar11 * -8;
          }
          else {
            uVar11 = in_R11 >> 3 & 0x1fffffff;
            uVar17 = uVar17 & 7;
            bVar19 = true;
          }
          in_R11 = (ulong)uVar17;
          puVar15 = (ulong *)((long)puVar15 - uVar11);
          pBVar16 = (BYTE *)*puVar15;
        }
        else {
LAB_001db875:
          bVar19 = false;
        }
        if (((BYTE *)((long)dst + -9) <= pBVar10) || (!bVar19)) goto LAB_001db9e4;
        uVar11 = (ulong)((long)pBVar16 << (in_R11 & 0x3f)) >> 0x35;
        *(short *)pBVar10 = (short)DTable[uVar11 + 1];
        uVar17 = (uint)*(byte *)((long)DTable + uVar11 * 4 + 6) + (int)in_R11;
        uVar11 = (ulong)*(byte *)((long)DTable + uVar11 * 4 + 7);
        uVar8 = (ulong)((long)pBVar16 << ((ulong)uVar17 & 0x3f)) >> 0x35;
        *(short *)(pBVar10 + uVar11) = (short)DTable[uVar8 + 1];
        uVar17 = *(byte *)((long)DTable + uVar8 * 4 + 6) + uVar17;
        uVar8 = (ulong)*(byte *)((long)DTable + uVar8 * 4 + 7);
        lVar4 = uVar8 + uVar11;
        uVar18 = (ulong)((long)pBVar16 << ((ulong)uVar17 & 0x3f)) >> 0x35;
        *(short *)(pBVar10 + uVar8 + uVar11) = (short)DTable[uVar18 + 1];
        uVar17 = *(byte *)((long)DTable + uVar18 * 4 + 6) + uVar17;
        uVar11 = (ulong)*(byte *)((long)DTable + uVar18 * 4 + 7);
        lVar5 = uVar11 + lVar4;
        uVar8 = (ulong)((long)pBVar16 << ((ulong)uVar17 & 0x3f)) >> 0x35;
        *(short *)(pBVar10 + uVar11 + lVar4) = (short)DTable[uVar8 + 1];
        uVar17 = *(byte *)((long)DTable + uVar8 * 4 + 6) + uVar17;
        uVar11 = (ulong)*(byte *)((long)DTable + uVar8 * 4 + 7);
        uVar8 = (ulong)((long)pBVar16 << ((ulong)uVar17 & 0x3f)) >> 0x35;
        *(short *)(pBVar10 + uVar11 + lVar5) = (short)DTable[uVar8 + 1];
        in_R11 = (ulong)(*(byte *)((long)DTable + uVar8 * 4 + 6) + uVar17);
        pBVar10 = pBVar10 + (ulong)*(byte *)((long)DTable + uVar8 * 4 + 7) + uVar11 + lVar5;
      } while( true );
    }
    uVar17 = (uint)in_R11;
    if (uVar17 < 0x41) {
      if (puVar15 < cSrcSize) {
        if (puVar15 == puVar14) goto LAB_001db9e4;
        uVar8 = in_R11 >> 3 & 0x1fffffff;
        uVar11 = (ulong)(uint)((int)puVar15 - iVar13);
        if (puVar14 <= (ulong *)((long)puVar15 - uVar8)) {
          uVar11 = uVar8;
        }
        uVar17 = uVar17 + (int)uVar11 * -8;
      }
      else {
        uVar11 = in_R11 >> 3 & 0x1fffffff;
        uVar17 = uVar17 & 7;
      }
      in_R11 = (ulong)uVar17;
      puVar15 = (ulong *)((long)puVar15 - uVar11);
      pBVar16 = (BYTE *)*puVar15;
    }
LAB_001db9e4:
    if (1 < (ulong)((long)dst - (long)pBVar10)) {
      do {
        uVar17 = (uint)in_R11;
        if (uVar17 < 0x41) {
          if (puVar15 < cSrcSize) {
            if (puVar15 == puVar14) goto LAB_001db9fe;
            uVar8 = in_R11 >> 3 & 0x1fffffff;
            bVar19 = puVar14 <= (ulong *)((long)puVar15 - uVar8);
            uVar11 = (ulong)(uint)((int)puVar15 - iVar13);
            if (bVar19) {
              uVar11 = uVar8;
            }
            uVar17 = uVar17 + (int)uVar11 * -8;
          }
          else {
            uVar11 = in_R11 >> 3 & 0x1fffffff;
            uVar17 = uVar17 & 7;
            bVar19 = true;
          }
          in_R11 = (ulong)uVar17;
          puVar15 = (ulong *)((long)puVar15 - uVar11);
          pBVar16 = (BYTE *)*puVar15;
        }
        else {
LAB_001db9fe:
          bVar19 = false;
        }
        if (((BYTE *)((long)dst + -2) < pBVar10) || (!bVar19)) goto LAB_001dbaad;
        uVar11 = (ulong)((long)pBVar16 << (in_R11 & 0x3f)) >> 0x35;
        *(short *)pBVar10 = (short)DTable[uVar11 + 1];
        pBVar10 = pBVar10 + *(byte *)((long)DTable + uVar11 * 4 + 7);
        in_R11 = (ulong)((uint)*(byte *)((long)DTable + uVar11 * 4 + 6) + (int)in_R11);
      } while( true );
    }
    goto LAB_001dbab2;
  }
  bVar19 = false;
  sVar6 = sVar12;
  goto LAB_001dbb21;
LAB_001dbaad:
  for (; pBVar10 <= (BYTE *)((long)dst + -2);
      pBVar10 = pBVar10 + *(byte *)((long)DTable + uVar11 * 4 + 7)) {
    uVar11 = (ulong)((long)pBVar16 << (in_R11 & 0x3f)) >> 0x35;
    *(short *)pBVar10 = (short)DTable[uVar11 + 1];
    in_R11 = (ulong)((uint)*(byte *)((long)DTable + uVar11 * 4 + 6) + (int)in_R11);
  }
LAB_001dbab2:
  if (pBVar10 < dst) {
    uVar11 = (ulong)((long)pBVar16 << (in_R11 & 0x3f)) >> 0x35;
    *pBVar10 = (BYTE)DTable[uVar11 + 1];
    uVar17 = (uint)in_R11;
    if (*(char *)((long)DTable + uVar11 * 4 + 7) == '\x01') {
      in_R11 = (ulong)(uVar17 + *(byte *)((long)DTable + uVar11 * 4 + 6));
    }
    else if ((uVar17 < 0x40) &&
            (uVar17 = uVar17 + *(byte *)((long)DTable + uVar11 * 4 + 6), in_R11 = (ulong)uVar17,
            0x3f < uVar17)) {
      in_R11 = 0x40;
    }
    pBVar10 = pBVar10 + 1;
  }
  pBVar3 = local_c8.op[lVar9];
  local_c8.op[lVar9] = pBVar10 + ((long)pBVar3 - (long)pBVar2);
  bVar19 = pBVar10 + ((long)pBVar3 - (long)pBVar2) == (BYTE *)dst;
  if (!bVar19) {
    sVar6 = 0xffffffffffffffec;
  }
LAB_001dbb21:
  if (!bVar19) {
    return sVar6;
  }
  lVar9 = lVar9 + 1;
  in_R10 = puVar15;
  if (lVar9 == 4) {
    return dstSize;
  }
  goto LAB_001db7ee;
}

Assistant:

static HUF_FAST_BMI2_ATTRS size_t
HUF_decompress4X2_usingDTable_internal_fast(
          void* dst,  size_t dstSize,
    const void* cSrc, size_t cSrcSize,
    const HUF_DTable* DTable,
    HUF_DecompressFastLoopFn loopFn) {
    void const* dt = DTable + 1;
    const BYTE* const iend = (const BYTE*)cSrc + 6;
    BYTE* const oend = (BYTE*)dst + dstSize;
    HUF_DecompressFastArgs args;
    {
        size_t const ret = HUF_DecompressFastArgs_init(&args, dst, dstSize, cSrc, cSrcSize, DTable);
        FORWARD_IF_ERROR(ret, "Failed to init asm args");
        if (ret == 0)
            return 0;
    }

    assert(args.ip[0] >= args.ilimit);
    loopFn(&args);

    /* note : op4 already verified within main loop */
    assert(args.ip[0] >= iend);
    assert(args.ip[1] >= iend);
    assert(args.ip[2] >= iend);
    assert(args.ip[3] >= iend);
    assert(args.op[3] <= oend);
    (void)iend;

    /* finish bitStreams one by one */
    {
        size_t const segmentSize = (dstSize+3) / 4;
        BYTE* segmentEnd = (BYTE*)dst;
        int i;
        for (i = 0; i < 4; ++i) {
            BIT_DStream_t bit;
            if (segmentSize <= (size_t)(oend - segmentEnd))
                segmentEnd += segmentSize;
            else
                segmentEnd = oend;
            FORWARD_IF_ERROR(HUF_initRemainingDStream(&bit, &args, i, segmentEnd), "corruption");
            args.op[i] += HUF_decodeStreamX2(args.op[i], &bit, segmentEnd, (HUF_DEltX2 const*)dt, HUF_DECODER_FAST_TABLELOG);
            if (args.op[i] != segmentEnd)
                return ERROR(corruption_detected);
        }
    }

    /* decoded size */
    return dstSize;
}